

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_ignore_zeros.c
# Opt level: O0

void test_option_ignore_zeros_mode_ru(char *mode)

{
  int iVar1;
  wchar_t wVar2;
  char *mode_local;
  
  iVar1 = make_files();
  if (iVar1 == 0) {
    wVar2 = systemf("%s %sf ab-cat.tar --ignore-zeros -C in c > test-ru.out 2> test-ru.err",testprog
                    ,mode);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                        ,L'o',0,"0",(long)wVar2,
                        "systemf( \"%s %sf ab-cat.tar --ignore-zeros -C in c \" \"> test-ru.out 2> test-ru.err\", testprog, mode)"
                        ,(void *)0x0);
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
               ,L'p',"test-ru.err");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
               ,L'q',"test-ru.out");
    wVar2 = systemf("%s xf ab-cat.tar --ignore-zeros -C out > test-x.out 2> test-x.err",testprog);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
                        ,L'v',0,"0",(long)wVar2,
                        "systemf( \"%s xf ab-cat.tar --ignore-zeros -C out \" \"> test-x.out 2> test-x.err\", testprog)"
                        ,(void *)0x0);
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
               ,L'w',"test-x.err");
    assertion_empty_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
               ,L'x',"test-x.out");
    assertion_equal_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
               ,L'z',"out/a","in/a");
    assertion_equal_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
               ,L'{',"out/b","in/b");
    assertion_equal_file
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/tar/test/test_option_ignore_zeros.c"
               ,L'|',"out/c","in/c");
  }
  return;
}

Assistant:

static void
test_option_ignore_zeros_mode_ru(const char *mode)
{
	if (make_files())
		return;

	assertEqualInt(0, systemf(
	    "%s %sf ab-cat.tar --ignore-zeros -C in c "
	    "> test-ru.out 2> test-ru.err",
	    testprog, mode));
	assertEmptyFile("test-ru.err");
	assertEmptyFile("test-ru.out");

	assertEqualInt(0, systemf(
	    "%s xf ab-cat.tar --ignore-zeros -C out "
	    "> test-x.out 2> test-x.err",
	    testprog));
	assertEmptyFile("test-x.err");
	assertEmptyFile("test-x.out");

	assertEqualFile("out/a", "in/a");
	assertEqualFile("out/b", "in/b");
	assertEqualFile("out/c", "in/c");
}